

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL>::get
          (SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL> *this,
          ExceptionOrValue *output)

{
  ExceptionOrValue *this_00;
  TypeByIndex<1UL,_kj::Promise<void>,_kj::Own<capnp::PipelineHook>_> *t;
  Own<capnp::PipelineHook> *t_00;
  ExceptionOr<kj::Own<capnp::PipelineHook>_> *pEVar1;
  Maybe<kj::Own<capnp::PipelineHook>_> local_48;
  Maybe<kj::Own<capnp::PipelineHook>_> local_38;
  Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_> *local_28;
  Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_> *value;
  ExceptionOr<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *hubResult;
  ExceptionOrValue *output_local;
  SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL> *this_local;
  
  hubResult = (ExceptionOr<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *)output
  ;
  output_local = (ExceptionOrValue *)this;
  this_00 = ForkBranchBase::getHubResultRef(&this->super_ForkBranchBase);
  value = (Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_> *)
          ExceptionOrValue::as<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>>
                    (this_00);
  local_28 = readMaybe<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>>
                       (&((ExceptionOr<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>
                           *)value)->value);
  if (local_28 == (Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_> *)0x0) {
    Maybe<kj::Own<capnp::PipelineHook>_>::Maybe(&local_48,(void *)0x0);
    pEVar1 = ExceptionOrValue::as<kj::Own<capnp::PipelineHook>>(&hubResult->super_ExceptionOrValue);
    Maybe<kj::Own<capnp::PipelineHook>_>::operator=(&pEVar1->value,&local_48);
    Maybe<kj::Own<capnp::PipelineHook>_>::~Maybe(&local_48);
  }
  else {
    t = get<1ul,kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>&>(local_28);
    t_00 = mv<kj::Own<capnp::PipelineHook>>(t);
    Maybe<kj::Own<capnp::PipelineHook>_>::Maybe(&local_38,t_00);
    pEVar1 = ExceptionOrValue::as<kj::Own<capnp::PipelineHook>>(&hubResult->super_ExceptionOrValue);
    Maybe<kj::Own<capnp::PipelineHook>_>::operator=(&pEVar1->value,&local_38);
    Maybe<kj::Own<capnp::PipelineHook>_>::~Maybe(&local_38);
  }
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)hubResult,(Maybe<kj::Exception> *)value);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,&hubResult->super_ExceptionOrValue);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(*value));
    } else {
      output.as<Element>().value = nullptr;
    }